

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O2

void ZopfliLZ77Optimal(ZopfliBlockState *s,uchar *in,size_t instart,size_t inend,int numiterations,
                      ZopfliLZ77Store *store)

{
  size_t *freqs;
  double *__src;
  double *__src_00;
  unsigned_short *length_array;
  float *costs;
  long lVar1;
  ulong uVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  uint local_3d74;
  double local_3d68;
  unsigned_short *path;
  ZopfliLZ77Store *local_3cf8;
  size_t *local_3cf0;
  double *local_3ce8;
  double *local_3ce0;
  double local_3cd8;
  size_t pathsize;
  RanState ran_state;
  ZopfliHash hash;
  ZopfliLZ77Store currentstore;
  SymbolStats stats;
  SymbolStats laststats;
  SymbolStats beststats;
  
  local_3cf8 = store;
  length_array = (unsigned_short *)malloc((inend - instart) * 2 + 2);
  path = (unsigned_short *)0x0;
  pathsize = 0;
  costs = (float *)malloc((inend - instart) * 4 + 4);
  if ((costs != (float *)0x0) && (length_array != (unsigned_short *)0x0)) {
    ran_state.m_w = 1;
    ran_state.m_z = 2;
    memset(&stats,0,0x1400);
    ZopfliInitLZ77Store(in,&currentstore);
    ZopfliAllocHash(0x8000,&hash);
    ZopfliLZ77Greedy(s,in,instart,inend,&currentstore,&hash);
    GetStatistics(&currentstore,&stats);
    freqs = stats.dists;
    __src = stats.ll_symbols;
    __src_00 = stats.d_symbols;
    local_3ce0 = laststats.ll_symbols;
    local_3ce8 = laststats.d_symbols;
    if (numiterations < 1) {
      numiterations = 0;
    }
    local_3cf0 = laststats.dists;
    local_3d74 = 0xffffffff;
    dVar4 = 0.0;
    local_3d68 = 1e+30;
    for (uVar3 = 0; uVar3 != numiterations; uVar3 = uVar3 + 1) {
      local_3cd8 = dVar4;
      ZopfliCleanLZ77Store(&currentstore);
      ZopfliInitLZ77Store(in,&currentstore);
      LZ77OptimalRun(s,in,instart,inend,&path,&pathsize,length_array,GetCostStat,&stats,
                     &currentstore,&hash,costs);
      dVar4 = ZopfliCalculateBlockSize(&currentstore,0,currentstore.size,2);
      if ((s->options->verbose_more != 0) || ((s->options->verbose != 0 && (dVar4 < local_3d68)))) {
        fprintf(_stderr,"Iteration %d: %d bit\n",(ulong)uVar3,(ulong)(uint)(int)dVar4);
      }
      if (dVar4 < local_3d68) {
        ZopfliCopyLZ77Store(&currentstore,local_3cf8);
        memcpy(&beststats,&stats,0x900);
        memcpy(beststats.dists,freqs,0x100);
        memcpy(beststats.ll_symbols,__src,0x900);
        memcpy(beststats.d_symbols,__src_00,0x100);
        local_3d68 = dVar4;
      }
      memcpy(&laststats,&stats,0x900);
      memcpy(local_3cf0,freqs,0x100);
      memcpy(local_3ce0,__src,0x900);
      memcpy(local_3ce8,__src_00,0x100);
      for (lVar1 = 0; lVar1 != 0x120; lVar1 = lVar1 + 1) {
        stats.litlens[lVar1] = 0;
      }
      for (lVar1 = 0x120; lVar1 != 0x140; lVar1 = lVar1 + 1) {
        stats.litlens[lVar1] = 0;
      }
      GetStatistics(&currentstore,&stats);
      if (local_3d74 != 0xffffffff) {
        for (lVar1 = 0; lVar1 != 0x120; lVar1 = lVar1 + 1) {
          dVar5 = (((double)CONCAT44(0x45300000,(int)(laststats.litlens[lVar1] >> 0x20)) -
                   1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)laststats.litlens[lVar1]) - 4503599627370496.0))
                  * 0.5 + ((double)CONCAT44(0x45300000,(int)(stats.litlens[lVar1] >> 0x20)) -
                          1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)stats.litlens[lVar1]) -
                          4503599627370496.0);
          uVar2 = (ulong)dVar5;
          stats.litlens[lVar1] = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2
          ;
        }
        for (lVar1 = 0x120; lVar1 != 0x140; lVar1 = lVar1 + 1) {
          dVar5 = (((double)CONCAT44(0x45300000,(int)(laststats.litlens[lVar1] >> 0x20)) -
                   1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)laststats.litlens[lVar1]) - 4503599627370496.0))
                  * 0.5 + ((double)CONCAT44(0x45300000,(int)(stats.litlens[lVar1] >> 0x20)) -
                          1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)stats.litlens[lVar1]) -
                          4503599627370496.0);
          uVar2 = (ulong)dVar5;
          stats.litlens[lVar1] = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2
          ;
        }
        stats.litlens[0x100] = 1;
        CalculateStatistics(&stats);
      }
      if (((5 < uVar3) && (dVar4 == local_3cd8)) && (!NAN(dVar4) && !NAN(local_3cd8))) {
        memcpy(&stats,&beststats,0x900);
        memcpy(freqs,beststats.dists,0x100);
        memcpy(__src,beststats.ll_symbols,0x900);
        memcpy(__src_00,beststats.d_symbols,0x100);
        RandomizeFreqs(&ran_state,stats.litlens,0x120);
        RandomizeFreqs(&ran_state,freqs,0x20);
        stats.litlens[0x100] = 1;
        CalculateStatistics(&stats);
        local_3d74 = uVar3;
      }
    }
    free(length_array);
    free(path);
    free(costs);
    ZopfliCleanLZ77Store(&currentstore);
    ZopfliCleanHash(&hash);
    return;
  }
  exit(-1);
}

Assistant:

void ZopfliLZ77Optimal(ZopfliBlockState *s,
                       const unsigned char* in, size_t instart, size_t inend,
                       int numiterations,
                       ZopfliLZ77Store* store) {
  /* Dist to get to here with smallest cost. */
  size_t blocksize = inend - instart;
  unsigned short* length_array =
      (unsigned short*)malloc(sizeof(unsigned short) * (blocksize + 1));
  unsigned short* path = 0;
  size_t pathsize = 0;
  ZopfliLZ77Store currentstore;
  ZopfliHash hash;
  ZopfliHash* h = &hash;
  SymbolStats stats, beststats, laststats;
  int i;
  float* costs = (float*)malloc(sizeof(float) * (blocksize + 1));
  double cost;
  double bestcost = ZOPFLI_LARGE_FLOAT;
  double lastcost = 0;
  /* Try randomizing the costs a bit once the size stabilizes. */
  RanState ran_state;
  int lastrandomstep = -1;

  if (!costs) exit(-1); /* Allocation failed. */
  if (!length_array) exit(-1); /* Allocation failed. */

  InitRanState(&ran_state);
  InitStats(&stats);
  ZopfliInitLZ77Store(in, &currentstore);
  ZopfliAllocHash(ZOPFLI_WINDOW_SIZE, h);

  /* Do regular deflate, then loop multiple shortest path runs, each time using
  the statistics of the previous run. */

  /* Initial run. */
  ZopfliLZ77Greedy(s, in, instart, inend, &currentstore, h);
  GetStatistics(&currentstore, &stats);

  /* Repeat statistics with each time the cost model from the previous stat
  run. */
  for (i = 0; i < numiterations; i++) {
    ZopfliCleanLZ77Store(&currentstore);
    ZopfliInitLZ77Store(in, &currentstore);
    LZ77OptimalRun(s, in, instart, inend, &path, &pathsize,
                   length_array, GetCostStat, (void*)&stats,
                   &currentstore, h, costs);
    cost = ZopfliCalculateBlockSize(&currentstore, 0, currentstore.size, 2);
    if (s->options->verbose_more || (s->options->verbose && cost < bestcost)) {
      fprintf(stderr, "Iteration %d: %d bit\n", i, (int) cost);
    }
    if (cost < bestcost) {
      /* Copy to the output store. */
      ZopfliCopyLZ77Store(&currentstore, store);
      CopyStats(&stats, &beststats);
      bestcost = cost;
    }
    CopyStats(&stats, &laststats);
    ClearStatFreqs(&stats);
    GetStatistics(&currentstore, &stats);
    if (lastrandomstep != -1) {
      /* This makes it converge slower but better. Do it only once the
      randomness kicks in so that if the user does few iterations, it gives a
      better result sooner. */
      AddWeighedStatFreqs(&stats, 1.0, &laststats, 0.5, &stats);
      CalculateStatistics(&stats);
    }
    if (i > 5 && cost == lastcost) {
      CopyStats(&beststats, &stats);
      RandomizeStatFreqs(&ran_state, &stats);
      CalculateStatistics(&stats);
      lastrandomstep = i;
    }
    lastcost = cost;
  }

  free(length_array);
  free(path);
  free(costs);
  ZopfliCleanLZ77Store(&currentstore);
  ZopfliCleanHash(h);
}